

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O1

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  BYTE **ppBVar1;
  U32 *pUVar2;
  uint uVar3;
  ulong *puVar4;
  size_t sVar5;
  rawSeq *prVar6;
  bool bVar7;
  U32 UVar8;
  uint uVar9;
  XXH64_hash_t XVar10;
  ulong uVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  BYTE *pBVar18;
  ldmEntry_t *plVar19;
  ulong *puVar20;
  ulong *puVar21;
  ulong uVar22;
  U32 UVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong *puVar27;
  ulong len;
  U32 u;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  ldmEntry_t **pplVar34;
  ulong *puVar35;
  BYTE *pInLoopLimit;
  ldmRollingHashState_t hashState;
  uint local_1dc;
  ulong *local_1d8;
  ulong local_1d0;
  ulong *local_1c8;
  ulong *local_1c0;
  BYTE *local_1b8;
  ldmMatchCandidate_t *local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  uint local_194;
  uint local_190;
  uint local_18c;
  ulong local_188;
  ulong *local_180;
  ldmState_t *local_178;
  BYTE *local_170;
  ulong local_168;
  ulong *local_160;
  ulong local_158;
  rawSeqStore_t *local_150;
  size_t local_148;
  ulong *local_140;
  ldmEntry_t *local_138;
  ulong *local_130;
  uint local_128;
  uint local_124;
  long local_120;
  void *local_118;
  size_t local_110;
  ulong local_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  ulong *local_e8;
  ulong *local_e0;
  ulong *local_d8;
  ldmEntry_t *local_d0;
  size_t local_c8;
  ulong *local_c0;
  ulong local_b8;
  long local_b0;
  ldmEntry_t **local_a8;
  long local_a0;
  size_t *local_98;
  BYTE *local_90;
  long local_88;
  ulong *local_80;
  ulong *local_78;
  BYTE *local_70;
  long local_68;
  ulong local_60;
  ulong *local_58;
  BYTE *local_50;
  BYTE *local_48;
  ldmRollingHashState_t local_40;
  
  uVar31 = 1 << ((byte)params->windowLog & 0x1f);
  lVar17 = (ulong)((srcSize & 0xfffff) != 0) + (srcSize >> 0x14);
  if (lVar17 != 0) {
    local_c0 = (ulong *)(srcSize + (long)src);
    local_128 = ~uVar31;
    local_98 = ldmState->splitIndices;
    local_1b0 = ldmState->matchCandidates;
    local_a8 = &ldmState->matchCandidates[0].bucket;
    local_b0 = 0;
    local_158 = 0;
    local_194 = uVar31;
    local_178 = ldmState;
    local_150 = sequences;
    local_120 = lVar17;
    local_118 = src;
    local_110 = srcSize;
    do {
      local_b8 = sequences->size;
      if (sequences->capacity <= local_b8) {
        return 0;
      }
      puVar35 = (ulong *)(local_b0 * 0x100000 + (long)src);
      local_1d8 = puVar35 + 0x20000;
      if (srcSize + local_b0 * -0x100000 < 0x100000) {
        local_1d8 = local_c0;
      }
      pBVar18 = (ldmState->window).base;
      iVar16 = (int)pBVar18;
      if (0xe0000000 < (uint)((int)local_1d8 - iVar16)) {
        UVar8 = params->hashLog;
        uVar14 = ((int)puVar35 - iVar16) + local_128;
        (ldmState->window).base = pBVar18 + uVar14;
        ppBVar1 = &(ldmState->window).dictBase;
        *ppBVar1 = *ppBVar1 + uVar14;
        uVar9 = (ldmState->window).dictLimit;
        uVar3 = (ldmState->window).lowLimit;
        UVar23 = uVar3 - uVar14;
        if (uVar3 < uVar14 || UVar23 == 0) {
          UVar23 = 1;
        }
        (ldmState->window).lowLimit = UVar23;
        UVar23 = uVar9 - uVar14;
        if (uVar9 < uVar14 || UVar23 == 0) {
          UVar23 = 1;
        }
        (ldmState->window).dictLimit = UVar23;
        pUVar2 = &(ldmState->window).nbOverflowCorrections;
        *pUVar2 = *pUVar2 + 1;
        plVar19 = ldmState->hashTable;
        lVar28 = 0;
        do {
          uVar9 = plVar19[lVar28].offset;
          UVar23 = uVar9 - uVar14;
          if (uVar9 < uVar14) {
            UVar23 = 0;
          }
          plVar19[lVar28].offset = UVar23;
          lVar28 = lVar28 + 1;
        } while (1L << ((byte)UVar8 & 0x3f) != lVar28);
        ldmState->loadedDictEnd = 0;
      }
      local_170 = (ldmState->window).base;
      uVar9 = (int)local_1d8 - (int)local_170;
      if (ldmState->loadedDictEnd + uVar31 < uVar9) {
        uVar9 = uVar9 - uVar31;
        if ((ldmState->window).lowLimit < uVar9) {
          (ldmState->window).lowLimit = uVar9;
        }
        uVar9 = (ldmState->window).lowLimit;
        if ((ldmState->window).dictLimit < uVar9) {
          (ldmState->window).dictLimit = uVar9;
        }
        ldmState->loadedDictEnd = 0;
      }
      uVar9 = (ldmState->window).dictLimit;
      uVar33 = (ulong)uVar9;
      local_190 = (ldmState->window).lowLimit;
      bVar12 = (byte)params->bucketSizeLog;
      local_68 = 1L << (bVar12 & 0x3f);
      uVar3 = params->minMatchLength;
      if (local_190 < uVar9) {
        local_50 = (ldmState->window).dictBase;
        local_18c = local_190;
      }
      else {
        local_50 = (BYTE *)0x0;
        local_18c = uVar9;
      }
      uVar24 = (long)local_1d8 - (long)puVar35;
      local_130 = (ulong *)(local_50 + uVar33);
      local_d8 = (ulong *)(local_50 + local_18c);
      if (uVar9 <= local_190) {
        local_130 = (ulong *)0x0;
        local_d8 = (ulong *)0x0;
      }
      len = (ulong)uVar3;
      local_108 = uVar24;
      if (len <= uVar24) {
        if (0x3f < uVar3) {
          uVar3 = 0x40;
        }
        bVar13 = (byte)params->hashRateLog;
        local_40.rolling = 0xffffffff;
        local_40.stopMask = ~(-1L << (bVar13 & 0x3f));
        if (params->hashRateLog - 1 < uVar3) {
          local_40.stopMask = local_40.stopMask << ((char)uVar3 - bVar13 & 0x3f);
        }
        local_160 = (ulong *)(local_170 + uVar33);
        local_58 = (ulong *)((long)puVar35 + uVar24);
        local_90 = (BYTE *)((long)puVar35 + (uVar24 - 8));
        local_1b8 = (BYTE *)((long)puVar35 + len);
        local_a0 = -len;
        local_124 = ~(-1 << ((char)params->hashLog - bVar12 & 0x1f));
        local_1c0 = (ulong *)((long)local_58 + -7);
        local_e0 = (ulong *)((long)local_58 + -3);
        local_e8 = (ulong *)((long)local_58 + -1);
        local_80 = local_160 + 1;
        local_70 = local_170 + -1;
        local_78 = (ulong *)((long)local_130 + -1);
        local_168 = uVar33;
        do {
          if (local_90 <= local_1b8) {
            uVar24 = (long)local_1d8 - (long)puVar35;
            lVar17 = local_120;
            sequences = local_150;
            srcSize = local_110;
            src = local_118;
            uVar31 = local_194;
            goto LAB_0020d9f6;
          }
          local_1dc = 0;
          local_148 = ZSTD_ldm_gear_feed(&local_40,local_1b8,(long)local_90 - (long)local_1b8,
                                         local_98,&local_1dc);
          uVar31 = local_124;
          uVar24 = (ulong)local_1dc;
          if (local_1dc != 0) {
            local_1c8 = (ulong *)(local_1b8 + local_a0);
            uVar32 = 0;
            pplVar34 = local_a8;
            local_180 = puVar35;
            do {
              pBVar18 = (BYTE *)(local_178->splitIndices[uVar32] + (long)local_1c8);
              XVar10 = XXH64(pBVar18,len,0);
              uVar9 = (uint)XVar10 & uVar31;
              ((ldmMatchCandidate_t *)(pplVar34 + -2))->split = pBVar18;
              *(uint *)(pplVar34 + -1) = uVar9;
              *(U32 *)((long)pplVar34 + -4) = (U32)(XVar10 >> 0x20);
              *pplVar34 = local_178->hashTable +
                          ((ulong)uVar9 << ((byte)params->bucketSizeLog & 0x3f));
              uVar32 = uVar32 + 1;
              uVar24 = (ulong)local_1dc;
              pplVar34 = pplVar34 + 3;
              ldmState = local_178;
              uVar33 = local_168;
              puVar35 = local_180;
            } while (uVar32 < uVar24);
          }
          if ((int)uVar24 != 0) {
            local_88 = -local_148;
            uVar32 = 0;
            do {
              local_60 = uVar32;
              puVar4 = (ulong *)local_1b0[local_60].split;
              uVar32 = (ulong)local_1b0[local_60].checksum;
              uVar29 = (ulong)local_1b0[local_60].hash;
              uVar25 = (long)puVar4 - (long)local_170;
              if (puVar4 < puVar35) {
                bVar12 = (byte)params->bucketSizeLog;
                pBVar18 = ldmState->bucketOffsets;
                bVar13 = pBVar18[uVar29];
                ldmState->hashTable[(uVar29 << (bVar12 & 0x3f)) + (ulong)bVar13] =
                     (ldmEntry_t)(uVar25 & 0xffffffff | uVar32 << 0x20);
                pBVar18[uVar29] = ~(byte)(-1 << (bVar12 & 0x1f)) & bVar13 + 1;
                iVar16 = 9;
                bVar7 = false;
              }
              else {
                plVar19 = local_1b0[local_60].bucket;
                local_d0 = plVar19 + local_68;
                local_100 = puVar4 + 1;
                local_140 = (ulong *)((long)puVar4 + -1);
                local_f0 = 0;
                local_f8 = 0;
                uVar22 = 0;
                local_138 = (ldmEntry_t *)0x0;
                do {
                  if (plVar19->checksum == local_1b0[local_60].checksum) {
                    uVar31 = plVar19->offset;
                    if (local_18c < uVar31) {
                      uVar9 = (uint)uVar33;
                      if (local_190 < uVar9) {
                        puVar21 = local_58;
                        local_48 = local_170;
                        if (uVar31 < uVar9) {
                          puVar21 = local_130;
                          local_48 = local_50;
                        }
                        local_1c8 = (ulong *)(local_48 + uVar31);
                        puVar20 = (ulong *)(((long)puVar21 - (long)local_1c8) + (long)puVar4);
                        if (local_1d8 <= puVar20) {
                          puVar20 = local_58;
                        }
                        puVar27 = local_1c8;
                        puVar26 = puVar4;
                        if (puVar4 < (ulong *)((long)puVar20 - 7U)) {
                          uVar11 = *puVar4 ^ *local_1c8;
                          uVar33 = 0;
                          if (uVar11 != 0) {
                            for (; (uVar11 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                            }
                          }
                          uVar11 = uVar33 >> 3 & 0x1fffffff;
                          puVar26 = local_100;
                          if (*local_1c8 == *puVar4) {
                            do {
                              puVar27 = puVar27 + 1;
                              if ((ulong *)((long)puVar20 - 7U) <= puVar26) goto LAB_0020d4b5;
                              uVar33 = *puVar26;
                              uVar15 = uVar33 ^ *puVar27;
                              uVar11 = 0;
                              if (uVar15 != 0) {
                                for (; (uVar15 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                                }
                              }
                              uVar11 = (long)puVar26 + ((uVar11 >> 3 & 0x1fffffff) - (long)puVar4);
                              puVar26 = puVar26 + 1;
                            } while (*puVar27 == uVar33);
                          }
                        }
                        else {
LAB_0020d4b5:
                          if ((puVar26 < (ulong *)((long)puVar20 - 3U)) &&
                             ((int)*puVar27 == (int)*puVar26)) {
                            puVar26 = (ulong *)((long)puVar26 + 4);
                            puVar27 = (ulong *)((long)puVar27 + 4);
                          }
                          if ((puVar26 < (ulong *)((long)puVar20 - 1U)) &&
                             ((short)*puVar27 == (short)*puVar26)) {
                            puVar26 = (ulong *)((long)puVar26 + 2);
                            puVar27 = (ulong *)((long)puVar27 + 2);
                          }
                          if (puVar26 < puVar20) {
                            puVar26 = (ulong *)((long)puVar26 +
                                               (ulong)((char)*puVar27 == (char)*puVar26));
                          }
                          uVar11 = (long)puVar26 - (long)puVar4;
                        }
                        if ((ulong *)((long)local_1c8 + uVar11) == puVar21) {
                          puVar21 = (ulong *)((long)puVar4 + uVar11);
                          puVar27 = local_160;
                          puVar20 = puVar21;
                          if (puVar21 < local_1c0) {
                            uVar15 = *puVar21 ^ *local_160;
                            uVar33 = 0;
                            if (uVar15 != 0) {
                              for (; (uVar15 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                              }
                            }
                            uVar33 = uVar33 >> 3 & 0x1fffffff;
                            puVar27 = local_80;
                            if (*local_160 == *puVar21) {
                              do {
                                puVar20 = puVar20 + 1;
                                if (local_1c0 <= puVar20) goto LAB_0020d67f;
                                uVar15 = *puVar27;
                                uVar30 = *puVar20 ^ uVar15;
                                uVar33 = 0;
                                if (uVar30 != 0) {
                                  for (; (uVar30 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                                  }
                                }
                                uVar33 = (long)puVar20 +
                                         ((uVar33 >> 3 & 0x1fffffff) - (long)puVar21);
                                puVar27 = puVar27 + 1;
                              } while (uVar15 == *puVar20);
                            }
                          }
                          else {
LAB_0020d67f:
                            if ((puVar20 < local_e0) && ((int)*puVar27 == (int)*puVar20)) {
                              puVar20 = (ulong *)((long)puVar20 + 4);
                              puVar27 = (ulong *)((long)puVar27 + 4);
                            }
                            if ((puVar20 < local_e8) && ((short)*puVar27 == (short)*puVar20)) {
                              puVar20 = (ulong *)((long)puVar20 + 2);
                              puVar27 = (ulong *)((long)puVar27 + 2);
                            }
                            if (puVar20 < local_1d8) {
                              puVar20 = (ulong *)((long)puVar20 +
                                                 (ulong)((char)*puVar27 == (char)*puVar20));
                            }
                            uVar33 = (long)puVar20 - (long)puVar21;
                          }
                          uVar11 = uVar11 + uVar33;
                        }
                        uVar33 = local_168;
                        if (len <= uVar11) {
                          puVar21 = local_160;
                          if (uVar31 < (uint)local_168) {
                            puVar21 = local_d8;
                          }
                          if (puVar35 < puVar4) {
                            lVar17 = 0;
                            if (puVar21 < local_1c8) {
                              puVar20 = (ulong *)(local_48 + uVar31);
                              lVar17 = 0;
                              puVar27 = local_140;
                              do {
                                puVar20 = (ulong *)((long)puVar20 + -1);
                                if (((char)*puVar27 != *(char *)puVar20) ||
                                   (lVar17 = lVar17 + 1, puVar27 <= puVar35)) break;
                                puVar27 = (ulong *)((long)puVar27 + -1);
                              } while (puVar21 < puVar20);
                            }
                          }
                          else {
                            lVar17 = 0;
                          }
                          if ((puVar21 != local_d8) &&
                             ((ulong *)((long)local_1c8 - lVar17) == puVar21)) {
                            if (local_d8 < local_130) {
                              lVar28 = 0;
                              if (puVar35 < (ulong *)((long)puVar4 + -lVar17)) {
                                puVar20 = (ulong *)(-lVar17 + (long)local_140);
                                lVar28 = 0;
                                puVar21 = local_78;
                                do {
                                  if (((char)*puVar20 != (char)*puVar21) ||
                                     (lVar28 = lVar28 + 1, puVar20 <= puVar35)) break;
                                  puVar20 = (ulong *)((long)puVar20 + -1);
                                  bVar7 = local_d8 < puVar21;
                                  puVar21 = (ulong *)((long)puVar21 + -1);
                                } while (bVar7);
                              }
                            }
                            else {
                              lVar28 = 0;
                            }
                            lVar17 = lVar17 + lVar28;
                          }
                        }
                      }
                      else {
                        puVar21 = (ulong *)(local_170 + uVar31);
                        puVar20 = puVar4;
                        if (puVar4 < local_1c0) {
                          uVar15 = *puVar4 ^ *puVar21;
                          uVar11 = 0;
                          if (uVar15 != 0) {
                            for (; (uVar15 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                            }
                          }
                          uVar11 = uVar11 >> 3 & 0x1fffffff;
                          puVar20 = local_100;
                          if (*puVar21 == *puVar4) {
                            do {
                              puVar21 = puVar21 + 1;
                              if (local_1c0 <= puVar20) goto LAB_0020d52e;
                              uVar15 = *puVar20;
                              uVar30 = uVar15 ^ *puVar21;
                              uVar11 = 0;
                              if (uVar30 != 0) {
                                for (; (uVar30 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                                }
                              }
                              uVar11 = (long)puVar20 + ((uVar11 >> 3 & 0x1fffffff) - (long)puVar4);
                              puVar20 = puVar20 + 1;
                            } while (*puVar21 == uVar15);
                          }
                        }
                        else {
LAB_0020d52e:
                          if ((puVar20 < local_e0) && ((int)*puVar21 == (int)*puVar20)) {
                            puVar20 = (ulong *)((long)puVar20 + 4);
                            puVar21 = (ulong *)((long)puVar21 + 4);
                          }
                          if ((puVar20 < local_e8) && ((short)*puVar21 == (short)*puVar20)) {
                            puVar20 = (ulong *)((long)puVar20 + 2);
                            puVar21 = (ulong *)((long)puVar21 + 2);
                          }
                          if (puVar20 < local_1d8) {
                            puVar20 = (ulong *)((long)puVar20 +
                                               (ulong)((char)*puVar21 == (char)*puVar20));
                          }
                          uVar11 = (long)puVar20 - (long)puVar4;
                        }
                        if (len <= uVar11) {
                          if (puVar35 < puVar4) {
                            lVar17 = 0;
                            if (uVar9 < uVar31) {
                              lVar17 = 0;
                              puVar21 = local_140;
                              puVar20 = (ulong *)(local_70 + uVar31);
                              do {
                                if (((char)*puVar21 != (char)*puVar20) ||
                                   (lVar17 = lVar17 + 1, puVar21 <= puVar35)) break;
                                puVar21 = (ulong *)((long)puVar21 + -1);
                                bVar7 = local_160 < puVar20;
                                puVar20 = (ulong *)((long)puVar20 + -1);
                              } while (bVar7);
                            }
                          }
                          else {
                            lVar17 = 0;
                          }
                        }
                      }
                      if ((len <= uVar11) && (uVar22 < lVar17 + uVar11)) {
                        uVar22 = lVar17 + uVar11;
                        local_138 = plVar19;
                        local_f8 = lVar17;
                        local_f0 = uVar11;
                      }
                    }
                  }
                  plVar19 = plVar19 + 1;
                } while (plVar19 < local_d0);
                ldmState = local_178;
                local_1d0 = uVar29;
                local_1a8 = uVar32;
                local_1a0 = uVar25;
                local_180 = puVar35;
                if (local_138 == (ldmEntry_t *)0x0) {
                  bVar12 = (byte)params->bucketSizeLog;
                  pBVar18 = local_178->bucketOffsets;
                  bVar13 = pBVar18[uVar29];
                  local_178->hashTable[(uVar29 << (bVar12 & 0x3f)) + (ulong)bVar13] =
                       (ldmEntry_t)(uVar25 & 0xffffffff | uVar32 << 0x20);
                  pBVar18[uVar29] = ~(byte)(-1 << (bVar12 & 0x1f)) & bVar13 + 1;
                  iVar16 = 9;
                }
                else {
                  sVar5 = local_150->size;
                  iVar16 = 0;
                  if (sVar5 != local_150->capacity) {
                    prVar6 = local_150->seq;
                    UVar8 = local_138->offset;
                    prVar6[sVar5].litLength = ((int)puVar4 - (int)local_f8) - (int)puVar35;
                    prVar6[sVar5].matchLength = (int)local_f0 + (int)local_f8;
                    prVar6[sVar5].offset = (int)uVar25 - UVar8;
                    local_150->size = sVar5 + 1;
                    bVar12 = (byte)params->bucketSizeLog;
                    pBVar18 = local_178->bucketOffsets;
                    bVar13 = pBVar18[uVar29];
                    local_178->hashTable[(uVar29 << (bVar12 & 0x3f)) + (ulong)bVar13] =
                         (ldmEntry_t)(uVar25 & 0xffffffff | uVar32 << 0x20);
                    pBVar18[uVar29] = ~(byte)(-1 << (bVar12 & 0x1f)) & bVar13 + 1;
                    puVar35 = (ulong *)((long)puVar4 + local_f0);
                    bVar7 = puVar35 <= local_1b8 + local_148;
                    if (!bVar7) {
                      local_1b8 = (BYTE *)(local_88 + (long)puVar35);
                      iVar16 = 7;
                    }
                    goto LAB_0020d974;
                  }
                  iVar16 = 1;
                }
                bVar7 = false;
              }
LAB_0020d974:
              local_188 = uVar24;
              if ((iVar16 != 0) && (iVar16 != 9)) {
                if (iVar16 != 7) goto LAB_0020d9a7;
                break;
              }
              uVar32 = local_60 + 1;
            } while (local_60 + 1 != uVar24);
          }
          local_1b8 = local_1b8 + local_148;
          bVar7 = true;
LAB_0020d9a7:
        } while (bVar7);
        uVar24 = 0xffffffffffffffba;
        lVar17 = local_120;
        sequences = local_150;
        srcSize = local_110;
        src = local_118;
        uVar31 = local_194;
      }
LAB_0020d9f6:
      uVar33 = uVar24;
      if (uVar24 < 0xffffffffffffff89) {
        uVar33 = local_c8;
        if (local_b8 < sequences->size) {
          pUVar2 = &sequences->seq[local_b8].litLength;
          *pUVar2 = *pUVar2 + (int)local_158;
          local_158 = uVar24;
        }
        else {
          local_158 = local_158 + local_108;
        }
      }
      local_c8 = uVar33;
      if (0xffffffffffffff88 < uVar24) {
        return local_c8;
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != lVar17);
  }
  return 0;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, 0, maxDist, ldmState->loadedDictEnd, chunkStart, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
            /* invalidate dictionaries on overflow correction */
            ldmState->loadedDictEnd = 0;
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         *
         * NOTE: Because of dictionaries + sequence splitting we MUST make sure
         * that any offset used is valid at the END of the sequence, since it may
         * be split into two sequences. This condition holds when using
         * ZSTD_window_enforceMaxDist(), but if we move to checking offsets
         * against maxDist directly, we'll have to carefully handle that case.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}